

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip32.c
# Opt level: O1

int bip32_key_serialize(ext_key *hdkey,uint32_t flags,uchar *bytes_out,size_t len)

{
  uint uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  _Bool _Var5;
  long lVar6;
  uint uVar7;
  int iVar8;
  
  iVar8 = -2;
  if ((hdkey != (ext_key *)0x0 && flags < 2) &&
     (((((flags & 1) != 0 || (hdkey->priv_key[0] == '\0')) &&
       (_Var5 = key_is_valid(hdkey), len == 0x4e)) && ((bytes_out != (uchar *)0x0 && (_Var5)))))) {
    uVar1 = hdkey->version;
    lVar6 = 0x3f;
    uVar7 = uVar1;
    if ((flags & 1) != 0) {
      lVar6 = 0x7f;
      uVar7 = 0x488b21e;
      if ((uVar1 != 0x488ade4) && (uVar7 = 0x43587cf, uVar1 != 0x4358394)) {
        uVar7 = uVar1;
      }
    }
    *(uint *)bytes_out =
         uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
    bytes_out[4] = hdkey->depth;
    *(undefined4 *)(bytes_out + 5) = *(undefined4 *)hdkey->parent160;
    uVar1 = hdkey->child_num;
    *(uint *)(bytes_out + 9) =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    uVar2 = *(undefined8 *)(hdkey->chain_code + 8);
    uVar3 = *(undefined8 *)(hdkey->chain_code + 0x10);
    uVar4 = *(undefined8 *)(hdkey->chain_code + 0x18);
    *(undefined8 *)(bytes_out + 0xd) = *(undefined8 *)hdkey->chain_code;
    *(undefined8 *)(bytes_out + 0x15) = uVar2;
    *(undefined8 *)(bytes_out + 0x1d) = uVar3;
    *(undefined8 *)(bytes_out + 0x25) = uVar4;
    uVar2 = *(undefined8 *)(hdkey->chain_code + lVar6 + 8);
    uVar3 = *(undefined8 *)(hdkey->chain_code + lVar6 + 0x10);
    uVar4 = *(undefined8 *)(hdkey->chain_code + lVar6 + 0x10 + 8);
    *(undefined8 *)(bytes_out + 0x2d) = *(undefined8 *)(hdkey->chain_code + lVar6);
    *(undefined8 *)(bytes_out + 0x35) = uVar2;
    *(undefined8 *)(bytes_out + 0x3d) = uVar3;
    *(undefined8 *)(bytes_out + 0x45) = uVar4;
    bytes_out[0x4d] = hdkey->parent160[lVar6];
    iVar8 = 0;
  }
  return iVar8;
}

Assistant:

int bip32_key_serialize(const struct ext_key *hdkey, uint32_t flags,
                        unsigned char *bytes_out, size_t len)
{
    const bool serialize_private = !(flags & BIP32_FLAG_KEY_PUBLIC);
    unsigned char *out = bytes_out;
    uint32_t tmp32;
    beint32_t tmp32_be;

    if (flags & ~BIP32_FLAG_KEY_PUBLIC)
        return WALLY_EINVAL; /* Only this flag makes sense here */

    /* Validate our arguments and then the input key */
    if (!hdkey ||
        (serialize_private && !key_is_private(hdkey)) ||
        !key_is_valid(hdkey) ||
        !bytes_out || len != BIP32_SERIALIZED_LEN)
        return WALLY_EINVAL;

    tmp32 = hdkey->version;
    if (!serialize_private) {
        /* Change version if serializing the public part of a private key */
        if (tmp32 == BIP32_VER_MAIN_PRIVATE)
            tmp32 = BIP32_VER_MAIN_PUBLIC;
        else if (tmp32 == BIP32_VER_TEST_PRIVATE)
            tmp32 = BIP32_VER_TEST_PUBLIC;
    }
    tmp32_be = cpu_to_be32(tmp32);
    out = copy_out(out, &tmp32_be, sizeof(tmp32_be));

    *out++ = hdkey->depth;

    /* Save the first 32 bits of the parent key (aka fingerprint) only */
    out = copy_out(out, hdkey->parent160, BIP32_KEY_FINGERPRINT_LEN);

    tmp32_be = cpu_to_be32(hdkey->child_num);
    out = copy_out(out, &tmp32_be, sizeof(tmp32_be));

    out = copy_out(out, hdkey->chain_code, sizeof(hdkey->chain_code));

    if (serialize_private)
        copy_out(out, hdkey->priv_key, sizeof(hdkey->priv_key));
    else
        copy_out(out, hdkey->pub_key, sizeof(hdkey->pub_key));

    return WALLY_OK;
}